

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O0

void __thiscall Hand::getHigherFinger(Hand *this)

{
  bool bVar1;
  reference pFVar2;
  Finger *f;
  iterator __end1;
  iterator __begin1;
  vector<Finger,_std::allocator<Finger>_> *__range1;
  Finger hf;
  int maxY;
  Hand *this_local;
  
  hf.boundingBox.width = -1;
  unique0x10000132 = this;
  Finger::Finger((Finger *)((long)&__range1 + 4));
  __end1 = std::vector<Finger,_std::allocator<Finger>_>::begin(&this->fingers);
  f = (Finger *)std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>
                                *)&f);
    if (!bVar1) break;
    pFVar2 = __gnu_cxx::__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>::
             operator*(&__end1);
    if ((hf.boundingBox.width == -1) || ((pFVar2->ptStart).y < hf.boundingBox.width)) {
      hf.boundingBox.width = (pFVar2->ptStart).y;
      Finger::operator=((Finger *)((long)&__range1 + 4),pFVar2);
    }
    __gnu_cxx::__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>::
    operator++(&__end1);
  }
  Finger::operator=(&this->higherFinger,(Finger *)((long)&__range1 + 4));
  return;
}

Assistant:

void Hand::getHigherFinger() {
    int maxY = -1;
    Finger hf;
    for (Finger &f : fingers) {
        if (maxY == -1 || f.ptStart.y < maxY) {
            maxY = f.ptStart.y;
            hf = f;
        }
    }
    higherFinger = hf;
}